

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_evalScript(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  int iVar2;
  JSRuntime *pJVar3;
  void *pvVar4;
  char *input;
  ulong uVar5;
  ulong uVar6;
  JSValue JVar8;
  BOOL backtrace_barrier;
  size_t len;
  int64_t iVar7;
  
  pJVar3 = JS_GetRuntime(ctx);
  pvVar4 = JS_GetRuntimeOpaque(pJVar3);
  backtrace_barrier = 0;
  iVar7 = 6;
  if (argc < 2) {
LAB_0010e608:
    input = JS_ToCStringLen(ctx,&len,*argv);
    if (input != (char *)0x0) {
      if ((*(long *)((long)pvVar4 + 0x48) == 0) &&
         (iVar2 = *(int *)((long)pvVar4 + 0x40), *(int *)((long)pvVar4 + 0x40) = iVar2 + 1,
         iVar2 == 0)) {
        pJVar3 = JS_GetRuntime(ctx);
        JS_SetInterruptHandler(pJVar3,interrupt_handler,(void *)0x0);
      }
      JVar8 = JS_Eval(ctx,input,len,"<evalScript>",(uint)(backtrace_barrier != 0) << 6);
      iVar7 = JVar8.tag;
      JS_FreeCString(ctx,input);
      if (*(long *)((long)pvVar4 + 0x48) == 0) {
        piVar1 = (int *)((long)pvVar4 + 0x40);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          pJVar3 = JS_GetRuntime(ctx);
          JS_SetInterruptHandler(pJVar3,(JSInterruptHandler *)0x0,(void *)0x0);
          os_pending_signals._0_1_ = (byte)os_pending_signals & 0xfb;
          if ((int)JVar8.tag == 6) {
            JS_ResetUncatchableError(ctx);
          }
        }
      }
      uVar6 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
      uVar5 = (ulong)JVar8.u.ptr & 0xffffffff;
      goto LAB_0010e6e0;
    }
  }
  else {
    iVar2 = get_bool_option(ctx,&backtrace_barrier,argv[1],"backtrace_barrier");
    if (iVar2 == 0) goto LAB_0010e608;
  }
  uVar5 = 0;
  uVar6 = 0;
LAB_0010e6e0:
  JVar8.u.ptr = (void *)(uVar5 | uVar6);
  JVar8.tag = iVar7;
  return JVar8;
}

Assistant:

static JSValue js_evalScript(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    const char *str;
    size_t len;
    JSValue ret;
    JSValueConst options_obj;
    BOOL backtrace_barrier = FALSE;
    int flags;
    
    if (argc >= 2) {
        options_obj = argv[1];
        if (get_bool_option(ctx, &backtrace_barrier, options_obj,
                            "backtrace_barrier"))
            return JS_EXCEPTION;
    }

    str = JS_ToCStringLen(ctx, &len, argv[0]);
    if (!str)
        return JS_EXCEPTION;
    if (!ts->recv_pipe && ++ts->eval_script_recurse == 1) {
        /* install the interrupt handler */
        JS_SetInterruptHandler(JS_GetRuntime(ctx), interrupt_handler, NULL);
    }
    flags = JS_EVAL_TYPE_GLOBAL; 
    if (backtrace_barrier)
        flags |= JS_EVAL_FLAG_BACKTRACE_BARRIER;
    ret = JS_Eval(ctx, str, len, "<evalScript>", flags);
    JS_FreeCString(ctx, str);
    if (!ts->recv_pipe && --ts->eval_script_recurse == 0) {
        /* remove the interrupt handler */
        JS_SetInterruptHandler(JS_GetRuntime(ctx), NULL, NULL);
        os_pending_signals &= ~((uint64_t)1 << SIGINT);
        /* convert the uncatchable "interrupted" error into a normal error
           so that it can be caught by the REPL */
        if (JS_IsException(ret))
            JS_ResetUncatchableError(ctx);
    }
    return ret;
}